

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Orientation.h
# Opt level: O3

void __thiscall DIS::AggregateStatePdu::setOrientation(AggregateStatePdu *this,Orientation *pX)

{
  float fVar1;
  
  (this->_orientation)._phi = pX->_phi;
  fVar1 = pX->_theta;
  (this->_orientation)._psi = pX->_psi;
  (this->_orientation)._theta = fVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT Orientation
{
protected:
  float _psi; 

  float _theta; 

  float _phi; 


 public:
    Orientation();
    virtual ~Orientation();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    float getPsi() const; 
    void setPsi(float pX); 

    float getTheta() const; 
    void setTheta(float pX); 

    float getPhi() const; 
    void setPhi(float pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const Orientation& rhs) const;
}